

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int mbedtls_pk_parse_subpubkey(uchar **p,uchar *end,mbedtls_pk_context_conflict *pk)

{
  int iVar1;
  mbedtls_pk_info_t *info;
  uchar *end_00;
  undefined1 local_58 [8];
  mbedtls_asn1_buf alg_params;
  size_t sStack_38;
  mbedtls_ecp_group_id ec_grp_id;
  size_t len;
  mbedtls_pk_type_t pk_alg;
  
  len._4_4_ = MBEDTLS_PK_NONE;
  alg_params.p._4_4_ = 0;
  iVar1 = mbedtls_asn1_get_tag(p,end,&stack0xffffffffffffffc8,0x30);
  if (iVar1 == 0) {
    end_00 = *p + sStack_38;
    iVar1 = pk_get_pk_alg(p,end_00,(mbedtls_pk_type_t *)((long)&len + 4),
                          (mbedtls_asn1_buf *)local_58,
                          (mbedtls_ecp_group_id *)((long)&alg_params.p + 4));
    if (iVar1 == 0) {
      iVar1 = mbedtls_asn1_get_bitstring_null(p,end_00,&stack0xffffffffffffffc8);
      if (iVar1 == 0) {
        iVar1 = -0x3b66;
        if (*p + sStack_38 == end_00) {
          info = mbedtls_pk_info_from_type(len._4_4_);
          if (info == (mbedtls_pk_info_t *)0x0) {
            iVar1 = -0x3c80;
          }
          else {
            iVar1 = mbedtls_pk_setup(pk,info);
            if (iVar1 == 0) {
              iVar1 = -0x3c80;
              if (((len._4_4_ & ~MBEDTLS_PK_RSA) == MBEDTLS_PK_ECKEY) &&
                 (iVar1 = pk_use_ecparams((mbedtls_asn1_buf *)local_58,pk), iVar1 == 0)) {
                iVar1 = pk_get_ecpubkey(p,end_00,pk);
              }
              if (iVar1 == 0) {
                iVar1 = -0x3b66;
                if (*p == end_00) {
                  iVar1 = 0;
                }
              }
              if (iVar1 != 0) {
                mbedtls_pk_free(pk);
              }
            }
          }
        }
      }
      else {
        iVar1 = iVar1 + -0x3b00;
      }
    }
  }
  else {
    iVar1 = iVar1 + -0x3d00;
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_subpubkey(unsigned char **p, const unsigned char *end,
                               mbedtls_pk_context *pk)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    mbedtls_asn1_buf alg_params;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    mbedtls_ecp_group_id ec_grp_id = MBEDTLS_ECP_DP_NONE;
    const mbedtls_pk_info_t *pk_info;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = *p + len;

    if ((ret = pk_get_pk_alg(p, end, &pk_alg, &alg_params, &ec_grp_id)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_asn1_get_bitstring_null(p, end, &len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if ((pk_info = mbedtls_pk_info_from_type(pk_alg)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA) {
        ret = pk_get_rsapubkey(p, end, mbedtls_pk_rsa(*pk));
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECKEY_DH || pk_alg == MBEDTLS_PK_ECKEY) {
#if defined(MBEDTLS_PK_HAVE_RFC8410_CURVES)
        if (MBEDTLS_PK_IS_RFC8410_GROUP_ID(ec_grp_id)) {
            ret = pk_use_ecparams_rfc8410(&alg_params, ec_grp_id, pk);
        } else
#endif
        {
            ret = pk_use_ecparams(&alg_params, pk);
        }
        if (ret == 0) {
            ret = pk_get_ecpubkey(p, end, pk);
        }
    } else
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */
    ret = MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    if (ret == 0 && *p != end) {
        ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if (ret != 0) {
        mbedtls_pk_free(pk);
    }

    return ret;
}